

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O0

SleighArchitecture * __thiscall
SleighArchitecture::normalizeSize(SleighArchitecture *this,string *nm)

{
  ulong uVar1;
  size_type pos;
  string *nm_local;
  string *res;
  
  std::__cxx11::string::string((string *)this,(string *)nm);
  uVar1 = std::__cxx11::string::find((char *)this,0x7448f0);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)this,uVar1);
  }
  uVar1 = std::__cxx11::string::find((char)this,0x2d);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)this,uVar1);
  }
  return this;
}

Assistant:

string SleighArchitecture::normalizeSize(const string &nm)

{
  string res = nm;
  string::size_type pos;
  
  pos = res.find("bit");
  if (pos != string::npos)
    res.erase(pos,3);
  pos = res.find('-');
  if (pos != string::npos)
    res.erase(pos,1);
  return res;
}